

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
get(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
   Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  pointer ppVar3;
  long lVar4;
  ulong uVar5;
  runtime_error *this_00;
  string *psVar6;
  ParseLocation l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ParseLocation local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  local_60;
  
  if (this->future == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&local_80,this);
    (*(this->super_RefCount)._vptr_RefCount[4])(&local_a0,this);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_embree::ParseLocation_&,_true>
              (&local_60,&local_a0,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (local_80.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    sVar1 = this->past;
    sVar2 = this->future;
    if (sVar2 + sVar1 == 0x400) {
      if (sVar1 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this->start = (ulong)((int)this->start + 1U & 0x3ff);
      this->past = sVar1 - 1;
    }
    this->future = sVar2 + 1;
    psVar6 = (string *)
             ((long)&(((this->buffer).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
             (ulong)(((int)sVar2 + (int)this->start + (int)this->past & 0x3ffU) << 6));
    std::__cxx11::string::_M_assign(psVar6);
    *(element_type **)(psVar6 + 0x20) =
         local_60.second.fileName.
         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(psVar6 + 0x28),
               &local_60.second.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    *(ssize_t *)(psVar6 + 0x30) = local_60.second.lineNumber;
    *(ssize_t *)(psVar6 + 0x38) = local_60.second.colNumber;
    if (local_60.second.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.second.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
  }
  ppVar3 = (this->buffer).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)(((int)this->past + (int)this->start & 0x3ffU) << 6);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar4 = *(long *)((long)&(ppVar3->first)._M_dataplus._M_p + uVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar4,
             *(long *)((long)&(ppVar3->first)._M_string_length + uVar5) + lVar4);
  this->past = this->past + 1;
  this->future = this->future - 1;
  return __return_storage_ptr__;
}

Assistant:

T get() {
      if (future == 0) push_back(nextHelper());
      T t = buffer[(start+past)%BUF_SIZE].first;
      past++; future--;
      return t;
    }